

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.h
# Opt level: O1

SquareMatrix<4> * pbrt::SquareMatrix<4>::Zero(void)

{
  SquareMatrix<4> *in_RDI;
  
  SquareMatrix(in_RDI);
  *(Float *)((long)(in_RDI->m + 0) + 0) = 0.0;
  *(Float *)((long)(in_RDI->m + 0) + 4) = 0.0;
  *(Float *)((long)(in_RDI->m + 0) + 8) = 0.0;
  *(Float *)((long)(in_RDI->m + 0) + 0xc) = 0.0;
  *(Float *)((long)(in_RDI->m + 1) + 0) = 0.0;
  *(Float *)((long)(in_RDI->m + 1) + 4) = 0.0;
  *(Float *)((long)(in_RDI->m + 1) + 8) = 0.0;
  *(Float *)((long)(in_RDI->m + 1) + 0xc) = 0.0;
  *(Float *)((long)(in_RDI->m + 2) + 0) = 0.0;
  *(Float *)((long)(in_RDI->m + 2) + 4) = 0.0;
  *(Float *)((long)(in_RDI->m + 2) + 8) = 0.0;
  *(Float *)((long)(in_RDI->m + 2) + 0xc) = 0.0;
  *(Float *)((long)(in_RDI->m + 3) + 0) = 0.0;
  *(Float *)((long)(in_RDI->m + 3) + 4) = 0.0;
  *(Float *)((long)(in_RDI->m + 3) + 8) = 0.0;
  *(Float *)((long)(in_RDI->m + 3) + 0xc) = 0.0;
  return in_RDI;
}

Assistant:

Zero() {
        SquareMatrix m;
        for (int i = 0; i < N; ++i)
            for (int j = 0; j < N; ++j)
                m.m[i][j] = 0;
        return m;
    }